

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t jessilib::find<char,char8_t,false>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char8_t,_std::char_traits<char8_t>_> in_substring)

{
  bool bVar1;
  size_t sVar2;
  char8_t *pcVar3;
  jessilib *pjVar4;
  jessilib *pjVar5;
  jessilib *extraout_RDX;
  char8_t *pcVar6;
  char *pcVar7;
  jessilib *this;
  char8_t *pcVar8;
  jessilib *this_00;
  jessilib *this_01;
  decode_result dVar9;
  decode_result dVar10;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_02;
  
  pjVar4 = (jessilib *)in_substring._M_len;
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (pjVar4 == (jessilib *)0x0) {
    pcVar3 = (char8_t *)0x0;
  }
  else {
    pcVar3 = (char8_t *)0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pjVar4 == (jessilib *)0x1) {
        in_string_00._M_str._0_1_ = *in_substring._M_str;
        in_string_00._M_str._1_7_ = 0;
        sVar2 = find<char,false>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar2;
      }
      pcVar8 = (char8_t *)0x0;
      for (; pcVar3 = (char8_t *)0xffffffffffffffff, pjVar5 = pjVar4, pcVar6 = in_substring._M_str,
          pcVar7 = in_string_00._M_len, this_00 = this, this_01 = pjVar4, this != (jessilib *)0x0;
          this = this + -(long)in_string_02._M_str) {
        do {
          in_string_01._M_str = (char *)pjVar5;
          in_string_01._M_len = (size_t)pcVar7;
          dVar9 = decode_codepoint_utf8<char>(this_00,in_string_01);
          in_string_02._M_str = (char8_t *)dVar9.units;
          in_string_02._M_len = (size_t)pcVar6;
          dVar10 = decode_codepoint_utf8<char8_t>(this_01,in_string_02);
          sVar2 = dVar10.units;
          if ((in_string_02._M_str == (char8_t *)0x0) || (sVar2 == 0)) {
            return (size_t)(char8_t *)0xffffffffffffffff;
          }
          bVar1 = equalsi(dVar9.codepoint,dVar10.codepoint);
          if (!bVar1) break;
          if (this_01 + -sVar2 == (jessilib *)0x0) {
            return (size_t)pcVar8;
          }
          this_00 = this_00 + -(long)in_string_02._M_str;
          pjVar5 = extraout_RDX;
          pcVar6 = pcVar6 + sVar2;
          pcVar7 = pcVar7 + (long)in_string_02._M_str;
          this_01 = this_01 + -sVar2;
        } while (this_00 != (jessilib *)0x0);
        in_string_00._M_len = in_string_00._M_len + (long)in_string_02._M_str;
        pcVar8 = pcVar8 + (long)in_string_02._M_str;
      }
    }
  }
  return (size_t)pcVar3;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}